

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
UA_Client_NamespaceGetIndex(UA_Client *client,UA_String *namespaceUri,UA_UInt16 *namespaceIndex)

{
  UA_Boolean UVar1;
  long lVar2;
  UA_Byte **ppUVar3;
  undefined8 *puVar4;
  byte bVar5;
  UA_ReadRequest in_stack_fffffffffffffd88;
  ulong local_1d8;
  size_t i;
  UA_String *ns;
  undefined1 local_1c0 [4];
  UA_StatusCode retval;
  UA_ReadResponse response;
  UA_DiagnosticInfo *local_100;
  UA_ReadValueId id;
  UA_ReadRequest request;
  UA_UInt16 *namespaceIndex_local;
  UA_String *namespaceUri_local;
  UA_Client *client_local;
  
  bVar5 = 0;
  UA_ReadRequest_init((UA_ReadRequest *)&id.dataEncoding.name.data);
  UA_ReadValueId_init((UA_ReadValueId *)&local_100);
  id.nodeId.identifier._8_4_ = 0xd;
  UA_NODEID_NUMERIC((UA_NodeId *)&response.diagnosticInfos,0,0x8cf);
  local_100 = response.diagnosticInfos;
  ppUVar3 = &id.dataEncoding.name.data;
  puVar4 = (undefined8 *)&stack0xfffffffffffffd88;
  for (lVar2 = 0x12; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *ppUVar3;
    ppUVar3 = ppUVar3 + (ulong)bVar5 * -2 + 1;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  UA_Client_Service_read((UA_ReadResponse *)local_1c0,client,in_stack_fffffffffffffd88);
  ns._4_4_ = 0;
  if (response.responseHeader.timestamp._4_4_ == 0) {
    if ((response.responseHeader.additionalHeader.content.encoded.body.data == (UA_Byte *)0x1) &&
       ((*(byte *)response.resultsSize & 1) != 0)) {
      if (*(long *)(response.resultsSize + 8) != 0x160590) {
        ns._4_4_ = 0x80740000;
      }
    }
    else {
      ns._4_4_ = 0x80620000;
    }
  }
  else {
    ns._4_4_ = response.responseHeader.timestamp._4_4_;
  }
  if (ns._4_4_ == 0) {
    ns._4_4_ = 0x803e0000;
    lVar2 = *(long *)(response.resultsSize + 0x20);
    for (local_1d8 = 0; local_1d8 < *(ulong *)(response.resultsSize + 0x18);
        local_1d8 = local_1d8 + 1) {
      UVar1 = UA_String_equal(namespaceUri,(UA_String *)(lVar2 + local_1d8 * 0x10));
      if (UVar1) {
        *namespaceIndex = (UA_UInt16)local_1d8;
        ns._4_4_ = 0;
        break;
      }
    }
    UA_ReadResponse_deleteMembers((UA_ReadResponse *)local_1c0);
    client_local._4_4_ = ns._4_4_;
  }
  else {
    UA_ReadResponse_deleteMembers((UA_ReadResponse *)local_1c0);
    client_local._4_4_ = ns._4_4_;
  }
  return client_local._4_4_;
}

Assistant:

UA_StatusCode
UA_Client_NamespaceGetIndex(UA_Client *client, UA_String *namespaceUri,
                            UA_UInt16 *namespaceIndex) {
    UA_ReadRequest request;
    UA_ReadRequest_init(&request);
    UA_ReadValueId id;
    UA_ReadValueId_init(&id);
    id.attributeId = UA_ATTRIBUTEID_VALUE;
    id.nodeId = UA_NODEID_NUMERIC(0, UA_NS0ID_SERVER_NAMESPACEARRAY);
    request.nodesToRead = &id;
    request.nodesToReadSize = 1;

    UA_ReadResponse response = UA_Client_Service_read(client, request);

    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    if(response.responseHeader.serviceResult != UA_STATUSCODE_GOOD)
        retval = response.responseHeader.serviceResult;
    else if(response.resultsSize != 1 || !response.results[0].hasValue)
        retval = UA_STATUSCODE_BADNODEATTRIBUTESINVALID;
    else if(response.results[0].value.type != &UA_TYPES[UA_TYPES_STRING])
        retval = UA_STATUSCODE_BADTYPEMISMATCH;

    if(retval != UA_STATUSCODE_GOOD) {
        UA_ReadResponse_deleteMembers(&response);
        return retval;
    }

    retval = UA_STATUSCODE_BADNOTFOUND;
    UA_String *ns = response.results[0].value.data;
    for(size_t i = 0; i < response.results[0].value.arrayLength; ++i){
        if(UA_String_equal(namespaceUri, &ns[i])) {
            *namespaceIndex = (UA_UInt16)i;
            retval = UA_STATUSCODE_GOOD;
            break;
        }
    }

    UA_ReadResponse_deleteMembers(&response);
    return retval;
}